

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeNaN.cpp
# Opt level: O2

void __thiscall wasm::DeNaN::visitFunction(DeNaN *this,Function *func)

{
  Module *wasm;
  string_view sVar1;
  size_t sVar2;
  Type TVar3;
  Call *pCVar4;
  Block *pBVar5;
  Index index;
  ulong uVar6;
  initializer_list<wasm::Expression_*> __l;
  initializer_list<wasm::Expression_*> __l_00;
  PassOptions local_258;
  undefined1 local_1b0 [8];
  PassRunner runner;
  undefined1 auStack_68 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> fixes;
  LocalSet *local_48;
  Builder local_40;
  Builder builder;
  
  if ((func->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
    local_40.wasm =
         (this->
         super_WalkerPass<wasm::ControlFlowWalker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>_>
         ).super_ControlFlowWalker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>.
         super_PostWalker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>.
         super_Walker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>.currModule;
    auStack_68 = (undefined1  [8])0x0;
    fixes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    fixes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    sVar2 = Function::getNumParams(func);
    uVar6 = 0;
    while (index = (Index)uVar6, uVar6 < sVar2) {
      TVar3 = Function::getLocalType(func,index);
      if (TVar3.id == 4) {
        sVar1 = (this->deNan32).super_IString.str;
        fixes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)MixedArena::alloc<wasm::LocalGet>(&(local_40.wasm)->allocator);
        ((LocalGet *)
        fixes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage)->index = index;
        (((LocalGet *)
         fixes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage)->
        super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = 4;
        __l._M_len = 1;
        __l._M_array = (iterator)
                       &fixes.
                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_1b0,__l,
                   (allocator_type *)((long)&builder.wasm + 7));
        pCVar4 = Builder::makeCall(&local_40,(Name)sVar1,
                                   (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                    *)local_1b0,(Type)0x4,false);
        local_48 = Builder::makeLocalSet(&local_40,index,(Expression *)pCVar4);
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        emplace_back<wasm::Expression*>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_68,
                   (Expression **)&local_48);
LAB_0082c8f7:
        std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
                  ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                   local_1b0);
      }
      else {
        TVar3 = Function::getLocalType(func,index);
        if (TVar3.id == 5) {
          sVar1 = (this->deNan64).super_IString.str;
          fixes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)MixedArena::alloc<wasm::LocalGet>(&(local_40.wasm)->allocator);
          ((LocalGet *)
          fixes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage)->index = index;
          (((LocalGet *)
           fixes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage)->
          super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = 5;
          __l_00._M_len = 1;
          __l_00._M_array =
               (iterator)
               &fixes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                    ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_1b0,
                     __l_00,(allocator_type *)((long)&builder.wasm + 7));
          pCVar4 = Builder::makeCall(&local_40,(Name)sVar1,
                                     (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                      *)local_1b0,(Type)0x5,false);
          local_48 = Builder::makeLocalSet(&local_40,index,(Expression *)pCVar4);
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_68,
                     (Expression **)&local_48);
          goto LAB_0082c8f7;
        }
      }
      uVar6 = (ulong)(index + 1);
    }
    if (auStack_68 !=
        (undefined1  [8])
        fixes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_68,
                 &func->body);
      pBVar5 = Builder::
               makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                         (&local_40,
                          (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                          auStack_68);
      func->body = (Expression *)pBVar5;
      wasm = (this->
             super_WalkerPass<wasm::ControlFlowWalker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>_>
             ).
             super_ControlFlowWalker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>
             .super_PostWalker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>.
             super_Walker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>.
             currModule;
      PassOptions::PassOptions
                (&local_258,
                 &((this->
                   super_WalkerPass<wasm::ControlFlowWalker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>_>
                   ).super_Pass.runner)->options);
      PassRunner::PassRunner((PassRunner *)local_1b0,wasm,&local_258);
      PassOptions::~PassOptions(&local_258);
      runner.options.funcEffectsMap.
      super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_1_ = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&runner.skippedPasses._M_h._M_single_bucket,"merge-blocks",
                 (allocator<char> *)&local_48);
      PassRunner::add((PassRunner *)local_1b0,(string *)&runner.skippedPasses._M_h._M_single_bucket)
      ;
      std::__cxx11::string::~string((string *)&runner.skippedPasses._M_h._M_single_bucket);
      PassRunner::run((PassRunner *)local_1b0);
      PassRunner::~PassRunner((PassRunner *)local_1b0);
    }
    std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
              ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_68);
  }
  return;
}

Assistant:

void visitFunction(Function* func) {
    if (func->imported()) {
      return;
    }
    // Instrument all locals as they enter the function.
    Builder builder(*getModule());
    std::vector<Expression*> fixes;
    auto num = func->getNumParams();
    for (Index i = 0; i < num; i++) {
      if (func->getLocalType(i) == Type::f32) {
        fixes.push_back(builder.makeLocalSet(
          i,
          builder.makeCall(
            deNan32, {builder.makeLocalGet(i, Type::f32)}, Type::f32)));
      } else if (func->getLocalType(i) == Type::f64) {
        fixes.push_back(builder.makeLocalSet(
          i,
          builder.makeCall(
            deNan64, {builder.makeLocalGet(i, Type::f64)}, Type::f64)));
      }
    }
    if (!fixes.empty()) {
      fixes.push_back(func->body);
      func->body = builder.makeBlock(fixes);
      // Merge blocks so we don't add an unnecessary one.
      PassRunner runner(getModule(), getPassOptions());
      runner.setIsNested(true);
      runner.add("merge-blocks");
      runner.run();
    }
  }